

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_dev.cpp
# Opt level: O1

TrackData * __thiscall
BlockFloppyDisk::load
          (TrackData *__return_storage_ptr__,BlockFloppyDisk *this,CylHead *cylhead,bool param_2)

{
  Format *this_00;
  pointer piVar1;
  pointer pSVar2;
  TrackData *pTVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  posix_error *this_01;
  int *piVar7;
  pointer piVar8;
  long lVar9;
  Sector *s;
  long sector;
  pointer this_02;
  vector<int,_std::allocator<int>_> error_ids;
  Track track;
  Data data;
  allocator_type local_a1;
  uint8_t *local_a0;
  vector<int,_std::allocator<int>_> local_98;
  int local_74;
  Track local_70;
  const_iterator local_50;
  const_iterator local_48;
  long local_40;
  TrackData *local_38;
  
  sector = (long)(this->super_DemandDisk).super_Disk.fmt.sectors *
           ((long)cylhead->head +
           (long)(this->super_DemandDisk).super_Disk.fmt.heads * (long)cylhead->cyl);
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_38 = __return_storage_ptr__;
  bVar4 = HDD::Seek((this->m_blockdev)._M_t.super___uniq_ptr_impl<HDD,_std::default_delete<HDD>_>.
                    _M_t.super__Tuple_impl<0UL,_HDD_*,_std::default_delete<HDD>_>.
                    super__Head_base<0UL,_HDD_*,_false>._M_head_impl,sector);
  if (!bVar4) {
    this_01 = (posix_error *)__cxa_allocate_exception(0x20);
    piVar7 = __errno_location();
    posix_error::posix_error(this_01,*piVar7,"seek");
    __cxa_throw(this_01,&posix_error::typeinfo,std::system_error::~system_error);
  }
  this_00 = &(this->super_DemandDisk).super_Disk.fmt;
  iVar5 = Format::track_size(this_00);
  local_a0 = AllocMem(iVar5);
  local_74 = iVar5;
  iVar6 = HDD::Read((this->m_blockdev)._M_t.super___uniq_ptr_impl<HDD,_std::default_delete<HDD>_>.
                    _M_t.super__Tuple_impl<0UL,_HDD_*,_std::default_delete<HDD>_>.
                    super__Head_base<0UL,_HDD_*,_false>._M_head_impl,local_a0,
                    (this->super_DemandDisk).super_Disk.fmt.sectors,false);
  iVar5 = (this->super_DemandDisk).super_Disk.fmt.sectors;
  if (0 < iVar5 && iVar6 < iVar5) {
    lVar9 = 0;
    do {
      iVar5 = Format::sector_size(this_00);
      bVar4 = HDD::Seek((this->m_blockdev)._M_t.
                        super___uniq_ptr_impl<HDD,_std::default_delete<HDD>_>._M_t.
                        super__Tuple_impl<0UL,_HDD_*,_std::default_delete<HDD>_>.
                        super__Head_base<0UL,_HDD_*,_false>._M_head_impl,(int)sector + lVar9);
      if (bVar4) {
        iVar5 = HDD::Read((this->m_blockdev)._M_t.
                          super___uniq_ptr_impl<HDD,_std::default_delete<HDD>_>._M_t.
                          super__Tuple_impl<0UL,_HDD_*,_std::default_delete<HDD>_>.
                          super__Head_base<0UL,_HDD_*,_false>._M_head_impl,local_a0 + iVar5 * lVar9,
                          1,false);
        if (iVar5 == 0) goto LAB_0017b02e;
      }
      else {
LAB_0017b02e:
        local_70._0_8_ =
             CHR(cylhead->cyl,cylhead->head,
                 (this->super_DemandDisk).super_Disk.fmt.base + (int)lVar9);
        Message<char_const*>(msgWarning,"error reading %s",(char **)&local_70);
        iVar5 = (this->super_DemandDisk).super_Disk.fmt.base + (int)lVar9;
        local_70.tracklen = iVar5;
        if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_98,
                     (iterator)
                     local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_70.tracklen);
        }
        else {
          *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar5;
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->super_DemandDisk).super_Disk.fmt.sectors);
  }
  Track::Track(&local_70,0);
  Track::format(&local_70,cylhead,this_00);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,local_a0,
             local_a0 + local_74,&local_a1);
  Track::populate(&local_70,local_50,local_48);
  piVar1 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar8 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar3 = local_38,
      pSVar2 = local_70.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
               super__Vector_impl_data._M_finish, piVar8 != piVar1; piVar8 = piVar8 + 1) {
    if (local_70.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_70.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar5 = *piVar8;
      this_02 = local_70.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if ((this_02->header).sector == iVar5) {
          Sector::set_baddatacrc(this_02,true);
        }
        this_02 = this_02 + 1;
      } while (this_02 != pSVar2);
    }
  }
  TrackData::TrackData(local_38,cylhead,&local_70);
  if (local_50._M_current != (uchar *)0x0) {
    operator_delete(local_50._M_current,local_40 - (long)local_50._M_current);
  }
  std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_70.m_sectors);
  FreeMem(local_a0);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pTVar3;
}

Assistant:

TrackData load(const CylHead& cylhead, bool /*first_read*/) override
    {
        auto lba = (cylhead.cyl * fmt.heads + cylhead.head) * fmt.sectors;
        std::vector<int> error_ids;

        if (!m_blockdev->Seek(lba))
            throw posix_error(errno, "seek");

        MEMORY mem(fmt.track_size());
        if (m_blockdev->Read(mem.pb, fmt.sectors) < fmt.sectors)
        {
            // Retry sectors individually
            for (auto i = 0; i < fmt.sectors; ++i)
            {
                auto p = mem.pb + i * fmt.sector_size();
                if (!m_blockdev->Seek(lba + i) || !m_blockdev->Read(p, 1))
                {
                    Message(msgWarning, "error reading %s",
                        CHR(cylhead.cyl, cylhead.head, fmt.base + i));
                    error_ids.push_back(fmt.base + i);
                }
            }
        }

        Track track;
        track.format(cylhead, fmt);

        Data data(mem.pb, mem.pb + mem.size);
        track.populate(data.begin(), data.end());

        // Flag any errors
        for (auto id : error_ids)
        {
            for (auto& s : track)
                if (s.header.sector == id)
                    s.set_baddatacrc();
        }

        return TrackData(cylhead, std::move(track));
    }